

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_table.h
# Opt level: O2

void __thiscall
charls::golomb_code_table::add_entry(golomb_code_table *this,uint8_t value,golomb_code c)

{
  uint __line;
  long lVar1;
  byte bVar2;
  ulong uVar3;
  char *__assertion;
  
  if (c.length_ < 9) {
    bVar2 = 8 - (char)c.length_;
    lVar1 = (ulong)value << (bVar2 & 0x3f);
    uVar3 = 0;
    while( true ) {
      if (uVar3 >> (bVar2 & 0x3f) != 0) {
        return;
      }
      if ((this->types_)._M_elems[lVar1 + uVar3].length_ != 0) break;
      (this->types_)._M_elems[lVar1 + uVar3] = c;
      uVar3 = uVar3 + 1;
    }
    __assertion = 
    "types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0";
    __line = 0x33;
  }
  else {
    __assertion = "static_cast<size_t>(length) <= byte_bit_count";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/lookup_table.h"
                ,__line,
                "void charls::golomb_code_table::add_entry(const uint8_t, const golomb_code)");
}

Assistant:

void add_entry(const uint8_t value, const golomb_code c) noexcept
    {
        const uint32_t length{c.length()};
        ASSERT(static_cast<size_t>(length) <= byte_bit_count);

        for (size_t i{}; i < conditional_static_cast<size_t>(1U) << (byte_bit_count - length); ++i)
        {
            ASSERT(types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0);
            types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i] = c;
        }
    }